

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::GlobalClockFunction::checkArguments
          (GlobalClockFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *this_00;
  bool bVar1;
  Symbol *pSVar2;
  Type *pTVar3;
  DiagCode code;
  
  this_00 = ((context->scope).ptr)->compilation;
  bVar1 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,0,0);
  if (bVar1) {
    if (((context->flags).m_bits & 0x20000) == 0) {
      code.subsystem = SysFuncs;
      code.code = 0x18;
    }
    else {
      pSVar2 = Compilation::getGlobalClockingAndNoteUse(this_00,(context->scope).ptr);
      if (pSVar2 != (Symbol *)0x0) {
        pTVar3 = Compilation::getType(this_00,EventType);
        return pTVar3;
      }
      bVar1 = Scope::isUninstantiated((context->scope).ptr);
      if (bVar1) goto LAB_004a2fc6;
      code.subsystem = SysFuncs;
      code.code = 0x1c;
    }
    ASTContext::addDiag(context,code,range);
  }
LAB_004a2fc6:
  return this_00->errorType;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 0, 0))
            return comp.getErrorType();

        if (!context.flags.has(ASTFlags::AllowClockingBlock)) {
            context.addDiag(diag::GlobalClockEventExpr, range);
            return comp.getErrorType();
        }

        if (!comp.getGlobalClockingAndNoteUse(*context.scope)) {
            if (!context.scope->isUninstantiated())
                context.addDiag(diag::NoGlobalClocking, range);
            return comp.getErrorType();
        }

        return comp.getType(SyntaxKind::EventType);
    }